

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O3

bool G_CheckSpot(int playernum,FPlayerStart *mthing)

{
  uint *puVar1;
  double dVar2;
  AActor *thing;
  sector_t *psVar3;
  long lVar4;
  double x;
  double y;
  DWORD DVar5;
  bool bVar6;
  subsector_t *psVar7;
  long lVar8;
  double dVar9;
  DVector2 local_28;
  
  DVar5 = level.flags;
  if (mthing->type == 0) {
    return false;
  }
  dVar2 = (mthing->pos).Z;
  x = (mthing->pos).X;
  y = (mthing->pos).Y;
  psVar7 = P_PointInSubsector(x,y);
  thing = (AActor *)(&players)[(long)playernum * 0x54];
  if (thing == (AActor *)0x0) {
    bVar6 = true;
    if (0 < playernum) {
      lVar8 = 0;
      do {
        lVar4 = *(long *)((long)&players + lVar8);
        if (lVar4 != 0) {
          if ((*(double *)(lVar4 + 0x48) == x) && (!NAN(*(double *)(lVar4 + 0x48)) && !NAN(x))) {
            if ((*(double *)(lVar4 + 0x50) == y) && (!NAN(*(double *)(lVar4 + 0x50)) && !NAN(y))) {
              return false;
            }
          }
        }
        lVar8 = lVar8 + 0x2a0;
      } while ((ulong)(uint)playernum * 0x2a0 - lVar8 != 0);
    }
  }
  else {
    dVar9 = 0.0;
    if ((DVar5 >> 0x1b & 1) != 0) {
      dVar9 = dVar2;
    }
    psVar3 = psVar7->sector;
    dVar2 = (thing->__Pos).Z;
    (thing->__Pos).Z =
         (y * (psVar3->floorplane).normal.Y +
         (psVar3->floorplane).normal.X * x + (psVar3->floorplane).D) * (psVar3->floorplane).negiC +
         dVar9;
    *(byte *)&(thing->flags).Value = (byte)(thing->flags).Value | 2;
    local_28.X = x;
    local_28.Y = y;
    bVar6 = P_CheckPosition(thing,&local_28,false);
    lVar8 = (&players)[(long)playernum * 0x54];
    puVar1 = (uint *)(lVar8 + 0x18c);
    *puVar1 = *puVar1 & 0xfffffffd;
    *(double *)(lVar8 + 0x58) = dVar2;
  }
  return bVar6;
}

Assistant:

bool G_CheckSpot (int playernum, FPlayerStart *mthing)
{
	DVector3 spot;
	double oldz;
	int i;

	if (mthing->type == 0) return false;

	spot = mthing->pos;

	if (!(level.flags & LEVEL_USEPLAYERSTARTZ))
	{
		spot.Z = 0;
	}
	spot.Z += P_PointInSector (spot)->floorplane.ZatPoint (spot);

	if (!players[playernum].mo)
	{ // first spawn of level, before corpses
		for (i = 0; i < playernum; i++)
			if (players[i].mo && players[i].mo->X() == spot.X && players[i].mo->Y() == spot.Y)
				return false;
		return true;
	}

	oldz = players[playernum].mo->Z();	// [RH] Need to save corpse's z-height
	players[playernum].mo->SetZ(spot.Z);		// [RH] Checks are now full 3-D

	// killough 4/2/98: fix bug where P_CheckPosition() uses a non-solid
	// corpse to detect collisions with other players in DM starts
	//
	// Old code:
	// if (!P_CheckPosition (players[playernum].mo, x, y))
	//    return false;

	players[playernum].mo->flags |=  MF_SOLID;
	i = P_CheckPosition(players[playernum].mo, spot);
	players[playernum].mo->flags &= ~MF_SOLID;
	players[playernum].mo->SetZ(oldz);	// [RH] Restore corpse's height
	if (!i)
		return false;

	return true;
}